

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

uint __thiscall
xercesc_4_0::WFElemStack::mapPrefixToURI(WFElemStack *this,XMLCh *prefixToMap,bool *unknown)

{
  uint uVar1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  XMLCh *pXVar6;
  XMLCh XVar7;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar8;
  
  *unknown = false;
  pRVar2 = (this->fPrefixPool).fHashTable;
  if ((prefixToMap == (XMLCh *)0x0) || (uVar4 = (ulong)(ushort)*prefixToMap, uVar4 == 0)) {
    uVar4 = 0;
  }
  else {
    XVar7 = prefixToMap[1];
    if (XVar7 != L'\0') {
      pXVar6 = prefixToMap + 2;
      do {
        uVar4 = (ulong)(ushort)XVar7 + (uVar4 >> 0x18) + uVar4 * 0x26;
        XVar7 = *pXVar6;
        pXVar6 = pXVar6 + 1;
      } while (XVar7 != L'\0');
    }
    uVar4 = uVar4 % pRVar2->fHashModulus;
  }
  pRVar8 = pRVar2->fBucketList[uVar4];
  if (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar3 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,prefixToMap,pRVar8->fKey);
      if (bVar3) {
        if ((pRVar8->fData != (PoolElem *)0x0) && (uVar1 = pRVar8->fData->fId, uVar1 != 0)) {
          if (uVar1 == this->fXMLPoolId) {
            this = (WFElemStack *)&this->fXMLNamespaceId;
            goto LAB_0029cc71;
          }
          if (uVar1 == this->fXMLNSPoolId) {
            this = (WFElemStack *)&this->fXMLNSNamespaceId;
            goto LAB_0029cc71;
          }
          uVar5 = this->fStack[this->fStackTop - 1]->fTopPrefix;
          if ((int)uVar5 < 0) goto LAB_0029cc62;
          goto LAB_0029cc54;
        }
        break;
      }
      pRVar8 = pRVar8->fNext;
    } while (pRVar8 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  goto LAB_0029cc69;
  while (bVar3 = 0 < (int)uVar5, uVar5 = uVar5 - 1, bVar3) {
LAB_0029cc54:
    if (this->fMap[uVar5].fPrefId == uVar1) {
      this = (WFElemStack *)&this->fMap[uVar5].fURIId;
      goto LAB_0029cc71;
    }
  }
LAB_0029cc62:
  if (*prefixToMap == L'\0') goto LAB_0029cc71;
LAB_0029cc69:
  *unknown = true;
  this = (WFElemStack *)&this->fUnknownNamespaceId;
LAB_0029cc71:
  return this->fEmptyNamespaceId;
}

Assistant:

unsigned int WFElemStack::mapPrefixToURI( const   XMLCh* const    prefixToMap
                                          ,       bool&           unknown) const
{
    // Assume we find it
    unknown = false;

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = fPrefixPool.getId(prefixToMap);
    if (!prefixId)
    {
        unknown = true;
        return fUnknownNamespaceId;
    }

    //
    //  Check for the special prefixes 'xml' and 'xmlns' since they cannot
    //  be overridden.
    //
    if (prefixId == fXMLPoolId)
        return fXMLNamespaceId;
    else if (prefixId == fXMLNSPoolId)
        return fXMLNSNamespaceId;

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    //  Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];
    for (int mapIndex = curRow->fTopPrefix; mapIndex >=0; mapIndex--)
    {
        if (fMap[mapIndex].fPrefId == prefixId)
            return fMap[mapIndex].fURIId;
    }

    //
    //  If the prefix is an empty string, then we will return the special
    //  global namespace id. This can be overridden, but no one has or we
    //  would have not gotten here.
    //
    if (!*prefixToMap)
        return fEmptyNamespaceId;

    // Oh well, don't have a clue so return the unknown id
    unknown = true;
    return fUnknownNamespaceId;
}